

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-properties.c
# Opt level: O3

wchar_t object_value_real(object *obj,wchar_t qty)

{
  obj_property *poVar1;
  byte bVar2;
  short sVar3;
  wchar_t wVar4;
  char *pcVar5;
  _Bool *p_Var6;
  object_kind *poVar7;
  _Bool _Var8;
  _Bool _Var9;
  int iVar10;
  int iVar11;
  wchar_t wVar12;
  int iVar13;
  obj_property *poVar14;
  char *pcVar15;
  char *pcVar16;
  angband_constants *paVar17;
  wchar_t *pwVar18;
  wchar_t wVar19;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  char **ppcVar24;
  wchar_t local_6c;
  
  _Var8 = tval_has_variable_power(obj);
  if (_Var8) {
    local_6c = obj->kind->cost;
    if (1 < z_info->property_max) {
      uVar20 = 1;
      do {
        wVar12 = obj_properties[uVar20].type;
        if (7 < (uint)(wVar12 + L'\xffffffff')) goto switchD_001ac29e_default;
        poVar1 = obj_properties + uVar20;
        wVar19 = obj_properties[uVar20].index;
        switch(wVar12) {
        default:
          if (obj->modifiers[wVar19] == 0) break;
LAB_001ac280:
          switch(wVar12) {
          case L'\x01':
          case L'\x02':
            iVar13 = (int)obj->modifiers[wVar19];
LAB_001ac7ce:
            iVar10 = -iVar13;
            if (0 < iVar13) {
              iVar10 = iVar13;
            }
            iVar13 = (iVar10 * poVar1->price_square + poVar1->price_linear) * iVar13;
            local_6c = local_6c + poVar1->price_constant;
            goto LAB_001ac7f1;
          case L'\x03':
          case L'\x05':
            goto switchD_001ac29e_caseD_3;
          case L'\x04':
            goto switchD_001ac29e_caseD_4;
          case L'\x06':
switchD_001ac29e_caseD_6:
            if (z_info->brand_max != '\0') {
              lVar21 = 0x20;
              uVar23 = 0;
              paVar17 = z_info;
              do {
                if ((obj->brands[uVar23] == true) &&
                   (poVar14 = brand_property((wchar_t)uVar23), poVar1 == poVar14)) {
                  iVar13 = *(int *)((long)&brands->code + lVar21);
                  _Var8 = tval_is_ammo(obj);
                  iVar10 = -iVar13;
                  if (0 < iVar13) {
                    iVar10 = iVar13;
                  }
                  iVar13 = ((iVar10 * poVar1->price_square + poVar1->price_linear) * iVar13 +
                           poVar1->price_constant) / (int)((uint)_Var8 * 9 + 1);
                  _Var9 = tval_is_melee_weapon(obj);
                  if (_Var8 || _Var9) {
                    iVar13 = (int)(iVar13 * (uint)obj->ds * (obj->dd + 1)) / 0x18;
                  }
                  local_6c = local_6c + iVar13;
                  paVar17 = z_info;
                }
                uVar23 = uVar23 + 1;
                lVar21 = lVar21 + 0x30;
              } while (uVar23 < paVar17->brand_max);
            }
            break;
          case L'\a':
switchD_001ac29e_caseD_7:
            if (z_info->slay_max != '\0') {
              uVar23 = 0;
              paVar17 = z_info;
              do {
                if ((obj->slays[uVar23] == true) &&
                   (poVar14 = slay_property((wchar_t)uVar23), poVar1 == poVar14)) {
                  iVar13 = slays[uVar23].multiplier;
                  _Var8 = tval_is_ammo(obj);
                  iVar10 = -iVar13;
                  if (0 < iVar13) {
                    iVar10 = iVar13;
                  }
                  iVar13 = ((iVar10 * poVar1->price_square + poVar1->price_linear) * iVar13 +
                           poVar1->price_constant) / (int)((uint)_Var8 + (uint)_Var8 * 8 + 1);
                  _Var9 = tval_is_melee_weapon(obj);
                  if (_Var8 || _Var9) {
                    iVar13 = (int)(iVar13 * (uint)obj->ds * (obj->dd + 1)) / 0x18;
                  }
                  p_Var6 = obj->brands;
                  paVar17 = z_info;
                  if (p_Var6 != (_Bool *)0x0) {
                    pcVar5 = poVar1->name;
                    iVar10 = strcmp(pcVar5,"slay evil creatures");
                    paVar17 = z_info;
                    if ((iVar10 != 0) && (bVar2 = z_info->brand_max, 1 < (ulong)bVar2)) {
                      ppcVar24 = &brands[1].name;
                      uVar22 = 1;
                      do {
                        if (p_Var6[uVar22] == true) {
                          pcVar16 = *ppcVar24;
                          pcVar15 = strstr(pcVar16,"poison brand");
                          if ((pcVar15 == (char *)0x0) &&
                             ((pcVar16 = strstr(pcVar16,"cold brand"), pcVar16 == (char *)0x0 ||
                              (iVar10 = strcmp(pcVar5,"slay undead"), iVar10 != 0)))) {
                            iVar10 = iVar13 + 3;
                            if (-1 < iVar13) {
                              iVar10 = iVar13;
                            }
                            iVar13 = iVar13 - (iVar10 >> 2);
                            break;
                          }
                        }
                        uVar22 = uVar22 + 1;
                        ppcVar24 = ppcVar24 + 6;
                      } while (bVar2 != uVar22);
                    }
                  }
                  local_6c = local_6c + iVar13;
                }
                uVar23 = uVar23 + 1;
              } while (uVar23 < paVar17->slay_max);
            }
            break;
          case L'\b':
switchD_001ac29e_caseD_8:
            poVar7 = obj->kind;
            pcVar5 = poVar1->name;
            iVar13 = strcmp(pcVar5,"enhanced dice");
            if (iVar13 != 0) {
              iVar13 = strcmp(pcVar5,"extra armor");
              if (iVar13 == 0) {
                iVar13 = (int)obj->ac - poVar7->ac;
              }
              else {
                iVar13 = strcmp(pcVar5,"armor bonus");
                if (iVar13 != 0) {
                  iVar13 = strcmp(pcVar5,"skill bonus");
                  if (iVar13 == 0) {
                    iVar13 = (int)obj->to_h - (poVar7->to_h).base;
                  }
                  else {
                    iVar13 = strcmp(pcVar5,"deadliness bonus");
                    if (iVar13 != 0) break;
                    iVar13 = (int)obj->to_d;
                  }
                  iVar10 = -iVar13;
                  if (0 < iVar13) {
                    iVar10 = iVar13;
                  }
                  wVar12 = poVar1->price_square;
                  wVar19 = poVar1->price_linear;
                  wVar4 = poVar1->price_constant;
                  _Var8 = tval_is_ammo(obj);
                  iVar11 = 1;
                  if (_Var8) {
                    iVar11 = 0x14;
                  }
                  iVar11 = ((iVar10 * wVar12 + wVar19) * iVar13 + wVar4) / iVar11;
                  goto LAB_001ac2ed;
                }
                iVar13 = (int)obj->to_a;
              }
              goto LAB_001ac7ce;
            }
            iVar13 = (uint)obj->dd * ((uint)obj->ds - poVar7->ds);
            iVar13 = iVar13 * iVar13 * 0x10;
LAB_001ac7f1:
            local_6c = local_6c + iVar13;
          }
          break;
        case L'\x03':
          _Var8 = flag_has_dbg(obj->flags,6,wVar19,"obj->flags","idx");
          if (_Var8) {
            wVar12 = poVar1->type;
            goto LAB_001ac280;
          }
          break;
        case L'\x04':
          if (obj->el_info[wVar19].res_level != 100) {
switchD_001ac29e_caseD_4:
            iVar11 = 100 - obj->el_info[wVar19].res_level;
            iVar13 = -iVar11;
            if (0 < iVar11) {
              iVar13 = iVar11;
            }
            iVar11 = (iVar13 * poVar1->price_square + poVar1->price_linear) * iVar11;
            local_6c = local_6c + poVar1->price_constant;
LAB_001ac2ed:
            local_6c = local_6c + iVar11;
          }
          break;
        case L'\x05':
          if ((obj->el_info[wVar19].flags & 2) != 0) {
switchD_001ac29e_caseD_3:
            local_6c = local_6c + poVar1->price_constant;
          }
          break;
        case L'\x06':
          p_Var6 = obj->brands;
          if ((p_Var6 != (_Bool *)0x0) && (bVar2 = z_info->brand_max, 1 < (ulong)bVar2)) {
            uVar23 = 1;
            do {
              if ((p_Var6[uVar23] == true) &&
                 (poVar14 = brand_property((wchar_t)uVar23), poVar14 == poVar1))
              goto switchD_001ac29e_caseD_6;
              uVar23 = uVar23 + 1;
            } while (bVar2 != uVar23);
          }
          break;
        case L'\a':
          if ((obj->slays != (_Bool *)0x0) && (bVar2 = z_info->slay_max, 1 < bVar2)) {
            wVar12 = L'\x01';
            do {
              poVar14 = slay_property(wVar12);
              if (poVar14 == poVar1) goto switchD_001ac29e_caseD_7;
              wVar12 = wVar12 + L'\x01';
            } while ((uint)bVar2 != wVar12);
          }
          break;
        case L'\b':
          pcVar5 = poVar1->name;
          iVar13 = strcmp(pcVar5,"enhanced dice");
          if (iVar13 == 0) {
            if ((obj->kind->dd < (int)(uint)obj->dd) || (obj->kind->ds < (int)(uint)obj->ds))
            goto switchD_001ac29e_caseD_8;
          }
          else {
            iVar13 = strcmp(pcVar5,"extra armor");
            if (iVar13 == 0) {
              if (obj->kind->ac < (int)obj->ac) goto switchD_001ac29e_caseD_8;
            }
            else {
              iVar13 = strcmp(pcVar5,"armor bonus");
              if (iVar13 == 0) {
                sVar3 = obj->to_a;
              }
              else {
                iVar13 = strcmp(pcVar5,"skill bonus");
                if (iVar13 == 0) {
                  sVar3 = obj->to_h;
                }
                else {
                  iVar13 = strcmp(pcVar5,"deadliness bonus");
                  if (iVar13 != 0) break;
                  sVar3 = obj->to_d;
                }
              }
              if (sVar3 != 0) goto switchD_001ac29e_caseD_8;
            }
          }
        }
switchD_001ac29e_default:
        uVar20 = uVar20 + 1;
      } while (uVar20 < z_info->property_max);
    }
    if ((obj->curses != (curse_data *)0x0) && (z_info->curse_max != '\0')) {
      lVar21 = 3;
      uVar20 = 0;
      paVar17 = z_info;
      do {
        if (obj->curses[uVar20].power != L'\0') {
          wVar12 = object_value_real(*(object **)(curses->conflict_flags + lVar21 * 8 + -0x28),
                                     L'\x01');
          local_6c = local_6c + wVar12;
          paVar17 = z_info;
        }
        uVar20 = uVar20 + 1;
        lVar21 = lVar21 + 7;
      } while (uVar20 < paVar17->curse_max);
    }
  }
  else {
    if (obj->artifact == (artifact *)0x0) {
      pwVar18 = &obj->kind->cost;
    }
    else {
      pwVar18 = &obj->artifact->cost;
    }
    wVar12 = *pwVar18;
    if (wVar12 == L'\0') {
      local_6c = L'\0';
    }
    else {
      wVar19 = wVar12 * qty;
      _Var8 = tval_can_have_charges(obj);
      if (_Var8) {
        iVar13 = obj->pval * qty;
        wVar19 = (((iVar13 / (int)(uint)obj->number + 1) -
                  (uint)(iVar13 % (int)(uint)obj->number == 0)) * wVar12) / 0x14 + wVar19;
      }
      local_6c = L'\0';
      if (L'\0' < wVar19) {
        local_6c = wVar19;
      }
    }
  }
  return local_6c;
}

Assistant:

int object_value_real(const struct object *obj, int qty)
{
	int value, total_value = 0;

	/* Wearables and ammo have prices that vary by individual item properties */
	if (tval_has_variable_power(obj)) {
		int i, j;

		/* Base cost */
		value = obj->kind->cost;

		/* Add/subtract value for properties */
		for (i = 1; i < z_info->property_max; i++) {
			struct obj_property *prop =	&obj_properties[i];
			int idx = prop->index;
			if (!object_has_property(obj, prop)) continue;
			switch (prop->type) {
				case OBJ_PROPERTY_STAT :
				case OBJ_PROPERTY_MOD :
				{
					value += property_cost(prop, obj->modifiers[idx], true);
					break;
				}
				case OBJ_PROPERTY_FLAG :
				{
					value += property_cost(prop, 0, true);
					break;
				}
				case OBJ_PROPERTY_ELEMENT :
				{
					int amount = RES_LEVEL_BASE - obj->el_info[idx].res_level;
					value += property_cost(prop, amount, true);
					break;
				}
				case OBJ_PROPERTY_IGNORE :
				{
					value += property_cost(prop, 0, true);
					break;
				}
				case OBJ_PROPERTY_BRAND :
				{
					for (j = 0; j < z_info->brand_max; j++) {
						if (obj->brands[j] && (prop == brand_property(j))) {
							int mult = brands[j].multiplier;
							int div = tval_is_ammo(obj) ? 10 : 1;
							int32_t bonus = property_cost(prop, mult, true) / div;
							/* Weapons with big dice are just better, so
							 * anything that enhances attacks is worth more on
							 them */
							if ((tval_is_melee_weapon(obj)) || (div == 10))	{
								bonus *= ((obj->dd + 1) * (obj->ds));
								bonus /= 24;
							}
							value += bonus;
						}
					}
					break;
				}
				case OBJ_PROPERTY_SLAY :
				{
					for (j = 0; j < z_info->slay_max; j++) {
						if (obj->slays[j] && (prop == slay_property(j))) {
							int mult = slays[j].multiplier;
							int div = tval_is_ammo(obj) ? 10 : 1;
							int32_t bonus = property_cost(prop, mult, true) / div;
							/* Weapons with big dice are just better, so
							 * anything that enhances attacks is worth more on
							 them */
							if ((tval_is_melee_weapon(obj)) || (div == 10))
							{
								bonus *= ((obj->dd + 1) * (obj->ds));
								bonus /= 24;
							}
							/* Cheap check for brands with broader applicability
							 * that might reduce the slay's practical value */
							if ((obj->brands) &&
								(!streq(prop->name, "slay evil creatures"))) {
								int k;
								bool reduce_bonus = false;
								for (k = 1; k < z_info->brand_max; k++)
								{
									if (!obj->brands[k]) continue;
									if (strstr(brands[k].name, "poison brand"))
										continue;
									if ((strstr(brands[k].name, "cold brand"))
										&& (streq(prop->name, "slay undead")))
										continue;
									reduce_bonus = true;
									break;
								}
								if (reduce_bonus) bonus -= (bonus / 4);
							}
							value += bonus;
						}
					}
					break;
				}
				case OBJ_PROPERTY_COMBAT :
				{
					struct object_kind *kind = obj->kind;
					if (streq(prop->name, "enhanced dice")) {
						value += (obj->ds - kind->ds) * (obj->ds - kind->ds)
							* obj->dd * obj->dd * 16L;
					} else if (streq(prop->name, "extra armor")) {
						value += property_cost(prop, obj->ac - kind->ac, true);
					} else if (streq(prop->name, "armor bonus")) {
						value += property_cost(prop, obj->to_a, true);
					} else if (streq(prop->name, "skill bonus")) {
						value += property_cost(prop, obj->to_h- kind->to_h.base,
											   true) /
							(tval_is_ammo(obj) ? 20 : 1);
					} else if (streq(prop->name, "deadliness bonus")) {
						value += property_cost(prop, obj->to_d, true) /
							(tval_is_ammo(obj) ? 20 : 1);
					}
					break;
				}
				default : break;
			}
		}

		/* Amend cost for curses */
		if (obj->curses) {
			for (i = 0; i < z_info->curse_max; i++) {
				if (obj->curses[i].power) {
					value += object_value_real(curses[i].obj, 1);
				}
			}
		}

		total_value = value;
	} else {
		/* Base cost */
		if (obj->artifact) {
			value = obj->artifact->cost;
		} else {
			value = obj->kind->cost;
		}

		/* Worthless items */
		if (!value) return (0L);

		/* Account for quantity */
		total_value = value * qty;

		/* Charge-holding devices need special treatment */
		if (tval_can_have_charges(obj)) {
			int charges;

			/* Calculate number of charges, rounded up */
			charges = obj->pval * qty / obj->number;
			if ((obj->pval * qty) % obj->number != 0)
				charges++;

			/* Pay extra for charges, depending on standard number of charges */
			total_value += value * charges / 20;
		}

		/* No negative value */
		if (total_value < 0) total_value = 0;
	}

	/* Return the value */
	return total_value;
}